

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstract_transaction.cpp
# Opt level: O0

void __thiscall TestTransaction::TestTransaction(TestTransaction *this)

{
  CfdException *this_00;
  allocator local_51;
  string local_50;
  int local_1c;
  wally_tx *pwStack_18;
  int ret;
  wally_tx *tx_pointer;
  TestTransaction *this_local;
  
  tx_pointer = (wally_tx *)this;
  cfd::core::AbstractTransaction::AbstractTransaction(&this->super_AbstractTransaction);
  (this->super_AbstractTransaction)._vptr_AbstractTransaction =
       (_func_int **)&PTR__TestTransaction_00884ab8;
  pwStack_18 = (wally_tx *)0x0;
  local_1c = wally_tx_init_alloc(2,0,0,0,&stack0xffffffffffffffe8);
  if (local_1c != 0) {
    this_00 = (CfdException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_50,"transaction data generate error.",&local_51);
    cfd::core::CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_50);
    __cxa_throw(this_00,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  (this->super_AbstractTransaction).wally_tx_pointer_ = pwStack_18;
  return;
}

Assistant:

TestTransaction() {
    struct wally_tx *tx_pointer = NULL;
    int ret = wally_tx_init_alloc(2, 0, 0, 0, &tx_pointer);
    if (ret != WALLY_OK) {
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "transaction data generate error.");
    }
    wally_tx_pointer_ = tx_pointer;
  }